

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::EnableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64,
          string *aPSKd,string *aProvisioningUrl)

{
  string *this_00;
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  int iVar4;
  char *pcVar5;
  const_iterator cVar6;
  pointer *__dest;
  ushort uVar7;
  size_t sVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar9;
  ByteArray *this_01;
  ulong uVar10;
  char *pcVar11;
  string_view fmt;
  format_args args;
  format_args args_00;
  ByteArray joinerId;
  writer write;
  ByteArray local_170;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  _Alloc_hider _Stack_148;
  undefined1 local_140 [16];
  code *local_130;
  _Alloc_hider local_128;
  undefined1 local_118 [24];
  _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
  *local_100;
  char *local_f8;
  string *local_f0;
  undefined1 local_e8 [8];
  pointer *local_e0;
  pointer local_d8;
  pointer local_d0 [2];
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string *local_98;
  writer local_90;
  CommissionerDataset local_88;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_a0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_a0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aProvisioningUrl;
  local_f0 = aPSKd;
  Commissioner::ComputeJoinerId(&local_170,aEui64);
  this_01 = &local_88.mSteeringData;
  local_88.mBorderAgentLocator = (this->mCommDataset).mBorderAgentLocator;
  local_88.mSessionId = (this->mCommDataset).mSessionId;
  local_f8 = (char *)aEui64;
  local_98 = aProvisioningUrl;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,&(this->mCommDataset).mSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88.mAeSteeringData,&(this->mCommDataset).mAeSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88.mNmkpSteeringData,&(this->mCommDataset).mNmkpSteeringData);
  uVar10._0_2_ = (this->mCommDataset).mJoinerUdpPort;
  uVar10._2_2_ = (this->mCommDataset).mAeUdpPort;
  uVar10._4_2_ = (this->mCommDataset).mNmkpUdpPort;
  uVar10._6_2_ = (this->mCommDataset).mPresentFlags;
  local_88._80_8_ = uVar10 & 0x3fffffffffffffff;
  if (aType == kMeshCoP) {
    uVar10 = CONCAT26(uVar10._6_2_,local_88._80_6_);
    local_88._80_8_ = uVar10 & 0x3fffffffffffffff | 0x2000000000000000;
    ValidatePSKd((Error *)local_158,local_f0);
    __return_storage_ptr__->mCode = local_158._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_150);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_150._M_p != local_140) {
      operator_delete(local_150._M_p);
    }
    if (EVar2 != kNone) goto LAB_001a9fe4;
  }
  else {
    uVar7 = 0x1000;
    this_01 = &local_88.mAeSteeringData;
    if (aType != kAE) {
      if (aType != kNMKP) {
        abort();
      }
      uVar7 = 0x800;
      this_01 = &local_88.mNmkpSteeringData;
    }
    local_88.mPresentFlags = uVar7 | uVar10._6_2_ & 0x3fff;
  }
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
    local_150._M_p = "the commissioner is not active";
    _Stack_148._M_p = (char *)0x1e;
    local_140._0_8_ = (char *)0x0;
    local_130 = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_140._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          *)local_158;
    do {
      pcVar11 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar11 == "") || (*pcVar11 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar11 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar5,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_158);
      }
      pcVar5 = pcVar11;
    } while (pcVar11 != "");
    args.field_1.args_ = aVar9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    ::fmt::v10::vformat_abi_cxx11_(&local_c0,(v10 *)0x249d58,(string_view)ZEXT816(0x1e),args);
    local_e8._0_4_ = 0xf;
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
LAB_001a9fa7:
    __return_storage_ptr__->mCode = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_001a9fe4;
  }
  else {
    local_158._0_4_ = aType;
    local_150._M_p = (char *)0x0;
    _Stack_148._M_p = (pointer)0x0;
    local_140._0_8_ = 0;
    uVar10 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (uVar10 == 0) {
      pcVar5 = (char *)0x0;
      sVar8 = 0;
    }
    else {
      if ((long)uVar10 < 0) {
        std::__throw_bad_alloc();
      }
      pcVar5 = (char *)operator_new(uVar10);
      sVar8 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    local_100 = (_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                 *)&this->mJoiners;
    local_140._0_8_ = pcVar5 + uVar10;
    local_150._M_p = pcVar5;
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      _Stack_148._M_p = pcVar5;
      memmove(pcVar5,local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar8);
    }
    _Stack_148._M_p = pcVar5 + sVar8;
    cVar6 = std::
            _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::find((_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
                    *)local_100,(key_type *)local_158);
    if (local_150._M_p != (char *)0x0) {
      operator_delete(local_150._M_p);
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header) {
      local_158._0_4_ = int_type;
      local_158._4_4_ = ulong_long_type;
      pcVar5 = "joiner(type={}, EUI64={:X}) has already been enabled";
      local_150._M_p = "joiner(type={}, EUI64={:X}) has already been enabled";
      _Stack_148._M_p = (pointer)0x34;
      local_140._0_8_ = (char *)0x200000000;
      local_130 = ::fmt::v10::detail::
                  parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      local_128._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_140._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_158;
      local_90.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_158;
      do {
        cVar1 = *pcVar5;
        pcVar11 = pcVar5;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
            ::writer::operator()(&local_90,pcVar5,"");
            goto LAB_001a9f3b;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
        ::writer::operator()(&local_90,pcVar5,pcVar11);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                           (pcVar11,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                             *)local_158);
      } while (pcVar5 != "");
LAB_001a9f3b:
      local_158._4_4_ = none_type;
      local_158._0_4_ = aType;
      _Stack_148._M_p = local_f8;
      fmt.size_ = 0x41;
      fmt.data_ = (char *)0x34;
      args_00.field_1.args_ = aVar9.args_;
      args_00.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"joiner(type={}, EUI64={:X}) has already been enabled",fmt,args_00
                );
      local_e8._0_4_ = 0xd;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      goto LAB_001a9fa7;
    }
    Commissioner::AddJoiner(this_01,&local_170);
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x14])(local_158,peVar3,&local_88);
    __return_storage_ptr__->mCode = local_158._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_150);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_150._M_p != local_140) {
      operator_delete(local_150._M_p);
    }
    if (EVar2 != kNone) goto LAB_001a9fe4;
    MergeDataset(&this->mCommDataset,&local_88);
    uVar10 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_e8._0_4_ = aType;
    if (uVar10 == 0) {
      __dest = (pointer *)0x0;
      sVar8 = 0;
    }
    else {
      if ((long)uVar10 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer *)operator_new(uVar10);
      sVar8 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    local_d0[0] = (pointer)((long)__dest + uVar10);
    local_e0 = __dest;
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest,local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar8);
    }
    local_d8 = (pointer)((long)__dest + sVar8);
    JoinerInfo::JoinerInfo((JoinerInfo *)local_158,aType,(uint64_t)local_f8,local_f0,local_98);
    std::
    _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
    ::_M_emplace_unique<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo>
              (local_100,(JoinerKey *)local_e8,(JoinerInfo *)local_158);
    if (local_128._M_p != local_118) {
      operator_delete(local_128._M_p);
    }
    if (_Stack_148._M_p != local_140 + 8) {
      operator_delete(_Stack_148._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)local_e0;
    if (local_e0 == (pointer *)0x0) goto LAB_001a9fe4;
  }
  operator_delete(local_c0._M_dataplus._M_p);
LAB_001a9fe4:
  if (local_88.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mNmkpSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mAeSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableJoiner(JoinerType         aType,
                                    uint64_t           aEui64,
                                    const std::string &aPSKd,
                                    const std::string &aProvisioningUrl)
{
    Error error;
    auto  joinerId    = Commissioner::ComputeJoinerId(aEui64);
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    if (aType == JoinerType::kMeshCoP)
    {
        SuccessOrExit(error = ValidatePSKd(aPSKd));
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mJoiners.count({aType, joinerId}) == 0,
                 error = ERROR_ALREADY_EXISTS("joiner(type={}, EUI64={:X}) has already been enabled",
                                              utils::to_underlying(aType), aEui64));

    Commissioner::AddJoiner(steeringData, joinerId);
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.emplace(JoinerKey{aType, joinerId}, JoinerInfo{aType, aEui64, aPSKd, aProvisioningUrl});

exit:
    return error;
}